

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-buf.c
# Opt level: O0

int run_test_buf_large(void)

{
  long extraout_RDX;
  iovec *iobuf;
  uv_buf_t buf;
  
  uv_buf_init(0,0xffffffffffffffff);
  if (extraout_RDX == -1) {
    return 0;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-buf.c"
          ,0x23,"buf.len == SIZE_MAX");
  abort();
}

Assistant:

TEST_IMPL(buf_large) {
  uv_buf_t buf;

  buf = uv_buf_init(NULL, SIZE_MAX);
#ifdef _WIN32
  WSABUF* wbuf;

  wbuf = (WSABUF*) &buf;
  ASSERT(wbuf->len == buf.len);
#else
  struct iovec* iobuf;

  iobuf = (struct iovec*) &buf;
  ASSERT(iobuf->iov_len == buf.len);
  ASSERT(buf.len == SIZE_MAX);

  /* Verify that uv_buf_t is ABI-compatible with struct iovec. */
  ASSERT(sizeof(uv_buf_t) == sizeof(struct iovec));
  ASSERT(sizeof(((uv_buf_t*) 0)->base) ==
         sizeof(((struct iovec*) 0)->iov_base));
  ASSERT(sizeof(((uv_buf_t*) 0)->len) == sizeof(((struct iovec*) 0)->iov_len));
  ASSERT(offsetof(uv_buf_t, base) == offsetof(struct iovec, iov_base));
  ASSERT(offsetof(uv_buf_t, len) == offsetof(struct iovec, iov_len));
#endif

  return 0;
}